

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O1

void setAllToZero(bitboards *game,U64 endMask)

{
  ulong uVar1;
  
  uVar1 = ~endMask;
  game->WP = game->WP & uVar1;
  game->WN = game->WN & uVar1;
  game->WB = game->WB & uVar1;
  game->WR = game->WR & uVar1;
  game->WQ = game->WQ & uVar1;
  game->WK = game->WK & uVar1;
  game->BP = game->BP & uVar1;
  game->BN = game->BN & uVar1;
  game->BB = game->BB & uVar1;
  game->BR = game->BR & uVar1;
  game->BQ = game->BQ & uVar1;
  game->BK = game->BK & uVar1;
  return;
}

Assistant:

void setAllToZero(bitboards* game, U64 endMask) {
  U64 mask = ~endMask;
  game->WP &= mask;
  game->WN &= mask;
  game->WB &= mask;
  game->WR &= mask;
  game->WQ &= mask;
  game->WK &= mask;
  game->BP &= mask;
  game->BN &= mask;
  game->BB &= mask;
  game->BR &= mask;
  game->BQ &= mask;
  game->BK &= mask;
}